

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::BranchIf::~BranchIf(BranchIf *this)

{
  long lVar1;
  
  (this->super_Terminator).super_Object._vptr_Object = (_func_int **)&PTR__BranchIf_002fc5a0;
  lVar1 = 0x68;
  do {
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::clear
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
               ((long)&(((BranchIf *)(this->targets + -4))->super_Terminator).super_Object.
                       _vptr_Object + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -8);
  Object::~Object((Object *)this);
  return;
}

Assistant:

BranchIf (Expression& cond, Block& trueJump, Block& falseJump)
            : condition (cond), targets { trueJump, falseJump }
        {
            SOUL_ASSERT (targets[0] != targets[1]);
        }